

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O0

void __thiscall
iqxmlrpc::Auto_conn::Auto_conn(Auto_conn *this,Impl *client_impl,Client_base *client)

{
  bool bVar1;
  Client_options *this_00;
  Impl *pIVar2;
  Client_connection *pCVar3;
  Client_base *client_local;
  Impl *client_impl_local;
  Auto_conn *this_local;
  
  this->client_impl_ = client_impl;
  boost::scoped_ptr<iqxmlrpc::Client_connection>::scoped_ptr
            (&this->tmp_conn_,(Client_connection *)0x0);
  this_00 = opts(this);
  bVar1 = Client_options::keep_alive(this_00);
  if (bVar1) {
    pIVar2 = cimpl(this);
    bVar1 = boost::scoped_ptr<iqxmlrpc::Client_connection>::operator!(&pIVar2->conn_cache);
    if (bVar1) {
      pIVar2 = cimpl(this);
      pCVar3 = create_connection(this,client);
      boost::scoped_ptr<iqxmlrpc::Client_connection>::reset(&pIVar2->conn_cache,pCVar3);
    }
    pIVar2 = cimpl(this);
    pCVar3 = boost::scoped_ptr<iqxmlrpc::Client_connection>::get(&pIVar2->conn_cache);
    this->conn_ptr_ = pCVar3;
  }
  else {
    pCVar3 = create_connection(this,client);
    boost::scoped_ptr<iqxmlrpc::Client_connection>::reset(&this->tmp_conn_,pCVar3);
    pCVar3 = boost::scoped_ptr<iqxmlrpc::Client_connection>::get(&this->tmp_conn_);
    this->conn_ptr_ = pCVar3;
  }
  return;
}

Assistant:

Auto_conn( Client_base::Impl& client_impl, Client_base& client ):
    client_impl_(client_impl)
  {
    if (opts().keep_alive())
    {
      if (!cimpl().conn_cache)
        cimpl().conn_cache.reset( create_connection(client) );

      conn_ptr_ = cimpl().conn_cache.get();

    } else {
      tmp_conn_.reset( create_connection(client) );
      conn_ptr_ = tmp_conn_.get();
    }
  }